

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadMultiTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  size_type *psVar2;
  XML *this_00;
  pointer pTVar3;
  size_type sVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  size_t sVar8;
  undefined8 extraout_RAX;
  MultiTransformNode *pMVar9;
  long lVar10;
  GroupNode *this_01;
  runtime_error *this_02;
  uint uVar11;
  long *in_RDX;
  long lVar12;
  char *this_03;
  ulong uVar13;
  size_t i_3;
  size_t i_2;
  pointer pcVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [40];
  size_t local_80;
  XMLLoader *local_78;
  string str_time_steps;
  string local_50;
  
  this_00 = (XML *)*in_RDX;
  local_a8._32_8_ = this;
  local_78 = (XMLLoader *)xml;
  std::__cxx11::string::string((string *)local_a8,"time_steps",(allocator *)&local_c8);
  XML::parm(&str_time_steps,this_00,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  bVar6 = std::operator!=(&str_time_steps,"");
  if (bVar6) {
    uVar7 = std::__cxx11::stoi(&str_time_steps,(size_t *)0x0,10);
    uVar11 = 1;
    if (1 < (int)uVar7) {
      uVar11 = uVar7;
    }
  }
  else {
    uVar11 = 1;
  }
  pcVar14 = (pointer)(ulong)uVar11;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  local_a8._24_8_ = alignedMalloc((long)pcVar14 << 5,8);
  for (sVar8 = 0; (long)pcVar14 << 5 != sVar8; sVar8 = sVar8 + 0x20) {
    puVar1 = (undefined8 *)(local_a8._24_8_ + sVar8 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)(local_a8._24_8_ + sVar8 + 0x18) = 0;
  }
  lVar12 = 0;
  local_80 = 0;
  local_a8._8_8_ = pcVar14;
  local_a8._16_8_ = pcVar14;
  do {
    lVar10 = *in_RDX;
    if ((long)pcVar14 * 8 - lVar12 == 0) {
      if (*(long *)(lVar10 + 0x88) - *(long *)(lVar10 + 0x80) >> 3 == (ulong)(uVar11 + 1)) {
        pMVar9 = (MultiTransformNode *)SceneGraph::MultiTransformNode::operator_new(0x88);
        loadNode((XMLLoader *)&local_c8,(Ref<embree::XML> *)local_78);
        SceneGraph::MultiTransformNode::MultiTransformNode
                  (pMVar9,(avector<avector<AffineSpace3ff>_> *)local_a8,
                   (Ref<embree::SceneGraph::Node> *)&local_c8);
        sVar8 = local_80;
        if ((GroupNode *)local_c8._M_dataplus._M_p != (GroupNode *)0x0) {
          (**(code **)(*(long *)local_c8._M_dataplus._M_p + 0x18))();
        }
        lVar12 = 0x28;
        uVar13 = 0;
        while( true ) {
          pTVar3 = (pMVar9->spaces).
                   super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar10 = (long)(pMVar9->spaces).
                         super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3;
          if ((ulong)(lVar10 / 0x30) <= uVar13) break;
          *(byte *)((long)&(pTVar3->time_range).lower + lVar12) = (byte)sVar8 & 1;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x30;
        }
        *(MultiTransformNode **)local_a8._32_8_ = pMVar9;
        (*(pMVar9->super_Node).super_RefCount._vptr_RefCount[2])(pMVar9,uVar13,lVar10 % 0x30);
      }
      else {
        this_01 = (GroupNode *)operator_new(0x80);
        SceneGraph::GroupNode::GroupNode(this_01,0);
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        for (; pcVar14 < (pointer)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3);
            pcVar14 = pcVar14 + 1) {
          loadNode((XMLLoader *)&local_c8,(Ref<embree::XML> *)local_78);
          SceneGraph::GroupNode::add(this_01,(Ref<embree::SceneGraph::Node> *)&local_c8);
          if ((GroupNode *)local_c8._M_dataplus._M_p != (GroupNode *)0x0) {
            (**(code **)(*(long *)local_c8._M_dataplus._M_p + 0x18))();
          }
        }
        pMVar9 = (MultiTransformNode *)SceneGraph::MultiTransformNode::operator_new(0x88);
        local_c8._M_dataplus._M_p = (pointer)this_01;
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        sVar8 = local_80;
        SceneGraph::MultiTransformNode::MultiTransformNode
                  (pMVar9,(avector<avector<AffineSpace3ff>_> *)local_a8,
                   (Ref<embree::SceneGraph::Node> *)&local_c8);
        if ((GroupNode *)local_c8._M_dataplus._M_p != (GroupNode *)0x0) {
          (**(code **)(*(long *)local_c8._M_dataplus._M_p + 0x18))();
        }
        lVar12 = 0x28;
        uVar13 = 0;
        while( true ) {
          pTVar3 = (pMVar9->spaces).
                   super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar10 = (long)(pMVar9->spaces).
                         super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3;
          if ((ulong)(lVar10 / 0x30) <= uVar13) break;
          *(byte *)((long)&(pTVar3->time_range).lower + lVar12) = (byte)sVar8 & 1;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x30;
        }
        *(MultiTransformNode **)local_a8._32_8_ = pMVar9;
        (*(pMVar9->super_Node).super_RefCount._vptr_RefCount[2])(pMVar9,uVar13,lVar10 % 0x30);
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
      }
      lVar12 = 0x18;
      for (pcVar14 = (pointer)0x0; uVar5 = local_a8._24_8_, pcVar14 < (ulong)local_a8._8_8_;
          pcVar14 = pcVar14 + 1) {
        alignedFree(*(void **)(local_a8._24_8_ + lVar12));
        puVar1 = (undefined8 *)(uVar5 + -0x10 + lVar12);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)(uVar5 + lVar12) = 0;
        lVar12 = lVar12 + 0x20;
      }
      alignedFree((void *)local_a8._24_8_);
      alignedFree((void *)0x0);
      std::__cxx11::string::~string((string *)&str_time_steps);
      return (Ref<embree::SceneGraph::Node>)(Node *)local_a8._32_8_;
    }
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)(*(long *)(lVar10 + 0x80) + lVar12) + 0x30),"AffineSpaceArray"
                           );
    if (bVar6) {
      loadAffineSpace3faArray
                ((avector<AffineSpace3ff> *)&local_c8,local_78,
                 (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar12));
      uVar5 = local_a8._24_8_;
      alignedFree(*(void **)(local_a8._24_8_ + 0x18 + lVar12 * 4));
      sVar4 = local_c8._M_string_length;
      local_c8._M_string_length = 0;
      psVar2 = (size_type *)(uVar5 + 8 + lVar12 * 4);
      *psVar2 = sVar4;
      psVar2[1] = local_c8.field_2._M_allocated_capacity;
      local_c8.field_2._M_allocated_capacity = 0;
      *(undefined8 *)(uVar5 + 0x18 + lVar12 * 4) = local_c8.field_2._8_8_;
      local_c8.field_2._8_8_ = 0;
      alignedFree((void *)0x0);
    }
    else {
      this_03 = "QuaternionArray";
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)(*(long *)(*in_RDX + 0x80) + lVar12) + 0x30),
                              "QuaternionArray");
      if (!bVar6) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
        std::operator+(&local_c8,&local_50,": unknown transformation representation");
        std::runtime_error::runtime_error(this_02,(string *)&local_c8);
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      loadQuaternionArray((avector<AffineSpace3ff> *)&local_c8,(XMLLoader *)this_03,
                          (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar12));
      uVar5 = local_a8._24_8_;
      alignedFree(*(void **)(local_a8._24_8_ + 0x18 + lVar12 * 4));
      sVar4 = local_c8._M_string_length;
      local_c8._M_string_length = 0;
      psVar2 = (size_type *)(uVar5 + 8 + lVar12 * 4);
      *psVar2 = sVar4;
      psVar2[1] = local_c8.field_2._M_allocated_capacity;
      local_c8.field_2._M_allocated_capacity = 0;
      *(undefined8 *)(uVar5 + 0x18 + lVar12 * 4) = local_c8.field_2._8_8_;
      local_c8.field_2._8_8_ = 0;
      alignedFree((void *)0x0);
      local_80 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    lVar12 = lVar12 + 8;
  } while( true );
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadMultiTransformNode(const Ref<XML>& xml) 
  {
    /* parse number of time steps to use for instanced geometry */
    int time_steps = 1;
    std::string str_time_steps = xml->parm("time_steps");
    if (str_time_steps != "") time_steps = max(1,std::stoi(str_time_steps));

    bool quaternion = false;
    avector<AffineSpace3ff> space;
    avector<avector<AffineSpace3ff>> spaces(time_steps);
    size_t j = 0;
    for (size_t i=0; i<time_steps; i++) {
      if (xml->children[i]->name == "AffineSpaceArray") {
        spaces[j++] = loadAffineSpace3faArray(xml->children[i]);
      }
      else if (xml->children[i]->name == "QuaternionArray") {
        spaces[j++] = loadQuaternionArray(xml->children[i]);
        quaternion = true;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }
    assert(j == time_steps);

    if (xml->size() == time_steps+1) {
      auto node = new SceneGraph::MultiTransformNode(spaces,loadNode(xml->children[time_steps]));
      for (size_t i = 0; i < node->spaces.size(); ++i) {
        node->spaces[i].quaternion = quaternion;
      }
      return node;
    }

    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=time_steps; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));

    auto node = new  SceneGraph::MultiTransformNode(spaces,group.dynamicCast<SceneGraph::Node>());
    for (size_t i = 0; i < node->spaces.size(); ++i) {
      node->spaces[i].quaternion = quaternion;
    }
    return node;
  }